

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.c
# Opt level: O0

HT_Boolean ht_bag_init(HT_Bag *bag,size_t min_capacity)

{
  void **ppvVar1;
  bool bVar2;
  size_t min_capacity_local;
  HT_Bag *bag_local;
  
  ppvVar1 = (void **)ht_alloc(min_capacity << 3);
  bag->data = ppvVar1;
  bVar2 = bag->data != (void **)0x0;
  if (bVar2) {
    bag->min_capacity = min_capacity;
    bag->capacity = min_capacity;
    bag->size = 0;
  }
  bag_local._4_4_ = (uint)bVar2;
  return bag_local._4_4_;
}

Assistant:

HT_Boolean
ht_bag_init(HT_Bag* bag, size_t min_capacity)
{
    bag->data = ht_alloc(min_capacity * sizeof(void*));

    if (bag->data == NULL)
    {
        return HT_FALSE;
    }

    bag->min_capacity = min_capacity;
    bag->capacity = min_capacity;
    bag->size = 0;

    return HT_TRUE;
}